

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::setBasisElement(HPresolve *this,change c)

{
  _Map_pointer ppcVar1;
  change *pcVar2;
  iterator __position;
  pointer piVar3;
  change *pcVar4;
  ulong uVar5;
  int iStack_14;
  int local_10 [2];
  
  local_10[0] = c.col;
  uVar5 = c._0_8_ & 0xffffffff;
  if (0xd < uVar5) {
    return;
  }
  iStack_14 = c.row;
  switch(uVar5) {
  case 0:
  case 4:
  case 5:
    uVar5 = (long)iStack_14 + (long)(this->super_HPreData).numColOriginal;
    piVar3 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)((long)(this->super_HPreData).nonbasicFlag.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
      piVar3[uVar5] = 0;
      return;
    }
    goto LAB_00147d12;
  case 1:
    ppcVar1 = *(_Map_pointer *)
               ((long)&(this->super_HPreData).chng.c.
                       super__Deque_base<change,_std::allocator<change>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18);
    pcVar4 = (this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    pcVar2 = *(_Elt_pointer *)
              ((long)&(this->super_HPreData).chng.c.
                      super__Deque_base<change,_std::allocator<change>_>._M_impl.
                      super__Deque_impl_data._M_finish + 8);
    if (((long)pcVar4 - (long)pcVar2 >> 2) * -0x5555555555555555 +
        (((long)ppcVar1 -
          (long)*(_Map_pointer *)
                 ((long)&(this->super_HPreData).chng.c.
                         super__Deque_base<change,_std::allocator<change>_>._M_impl.
                         super__Deque_impl_data._M_start + 0x18) >> 3) + -1 +
        (ulong)(ppcVar1 == (_Map_pointer)0x0)) * 0x2a ==
        ((long)*(_Elt_pointer *)
                ((long)&(this->super_HPreData).chng.c.
                        super__Deque_base<change,_std::allocator<change>_>._M_impl.
                        super__Deque_impl_data._M_start + 0x10) -
         (long)(this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur >> 2) * 0x5555555555555555) {
      return;
    }
    if (pcVar4 == pcVar2) {
      pcVar4 = ppcVar1[-1] + 0x2a;
    }
    if (pcVar4[-1].type == 2) {
      return;
    }
  case 10:
  case 0xb:
  case 0xd:
    uVar5 = (ulong)local_10[0];
    goto LAB_00147ceb;
  default:
    goto switchD_00147ba3_caseD_2;
  case 7:
  case 9:
    (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_10[0]] = 0;
    break;
  case 8:
    piVar3 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_HPreData).nonbasicFlag.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar3 >> 2) <= (ulong)(long)local_10[0]) goto LAB_00147d12;
    piVar3[local_10[0]] = 0;
  }
  __position._M_current =
       (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&(this->super_HPreData).basicIndex,__position,
               local_10);
  }
  else {
    *__position._M_current = local_10[0];
    (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  uVar5 = (long)iStack_14 + (long)(this->super_HPreData).numColOriginal;
LAB_00147ceb:
  piVar3 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(this->super_HPreData).nonbasicFlag.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
    piVar3[uVar5] = 1;
switchD_00147ba3_caseD_2:
    return;
  }
LAB_00147d12:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void HPresolve::setBasisElement(change c) {

	//nonbasicFlag starts off as [numCol + numRow] and is already
	//increased to [numColOriginal + numRowOriginal] so fill in gaps

	switch (c.type) {
		case EMPTY_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case SING_ROW: {
			//elsewhere
			break;
		}
		case FORCING_ROW_VARIABLE:
			// variables set at a bound by forcing row fRjs.p
			// all nonbasic

			break;
		case FORCING_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case REDUNDANT_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case FREE_SING_COL:
		case IMPLIED_FREE_SING_COL: {
			nonbasicFlag[c.col] = 0;
			basicIndex.push_back(c.col);

			nonbasicFlag.at(numColOriginal + c.row) = 1;
			break;
		}
		case SING_COL_DOUBLETON_INEQ: {
			// column singleton in a doubleton inequality.
			nonbasicFlag.at(c.col) = 0;
			basicIndex.push_back(c.col);

			nonbasicFlag.at(numColOriginal + c.row) = 1;
			break;
		}
		case EMPTY_COL:
		case DOMINATED_COLS:
		case WEAKLY_DOMINATED_COLS: {
			nonbasicFlag.at(c.col) = 1;
			break;
		}
		case FIXED_COL: { //fixed variable:
			//check if it was NOT after singRow
			if (chng.size() > 0)
				if (chng.top().type != SING_ROW)
					nonbasicFlag.at(c.col) = 1;
			break;
		}

	}

}